

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O3

void __thiscall
amrex::StateData::InterpFillFab
          (StateData *this,MultiFabCopyDescriptor *multiFabCopyDesc,
          Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_> *mfid,
          Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_> *fillBoxIds,FArrayBox *dest,
          Real time,int src_comp,int dest_comp,int num_comp,bool extrap)

{
  double dVar1;
  double dVar2;
  TimeCenter TVar3;
  pointer pFVar4;
  FabArrayId faid;
  double dVar5;
  
  TVar3 = StateDescriptor::timeType(this->desc);
  if (TVar3 == Point) {
    pFVar4 = (mfid->super_vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>).
             super__Vector_base<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->old_data)._M_t.
        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl != (MultiFab *)0x0) {
      amrex::InterpFillFab
                (multiFabCopyDesc,fillBoxIds,(MultiFabId)pFVar4[1].fabArrayId,
                 (MultiFabId)pFVar4->fabArrayId,dest,(this->old_time).start,(this->new_time).start,
                 time,src_comp,dest_comp,num_comp,extrap);
      return;
    }
  }
  else {
    dVar1 = (this->new_time).start;
    dVar2 = (this->old_time).start;
    dVar5 = (dVar1 - dVar2) * 0.001;
    if ((time <= dVar1 - dVar5) || ((this->new_time).stop + dVar5 <= time)) {
      if ((time <= dVar2 - dVar5) ||
         (((this->old_data)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl == (MultiFab *)0x0 ||
          (dVar5 + (this->old_time).stop <= time)))) {
        Error_host("StateData::Interp(): cannot interp");
        return;
      }
      faid.fabArrayId =
           (mfid->super_vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>).
           super__Vector_base<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>._M_impl.
           super__Vector_impl_data._M_start[1].fabArrayId;
      goto LAB_004d0450;
    }
    pFVar4 = (mfid->super_vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>).
             super__Vector_base<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  faid.fabArrayId = pFVar4->fabArrayId;
LAB_004d0450:
  FabArrayCopyDescriptor<amrex::FArrayBox>::FillFab
            (&multiFabCopyDesc->super_FabArrayCopyDescriptor<amrex::FArrayBox>,faid,
             (fillBoxIds->super_vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>).
             super__Vector_base<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>._M_impl.
             super__Vector_impl_data._M_start,dest);
  return;
}

Assistant:

void
StateData::InterpFillFab (MultiFabCopyDescriptor&  multiFabCopyDesc,
                          const Vector<MultiFabId>& mfid,
                          const Vector<FillBoxId>&  fillBoxIds,
                          FArrayBox&               dest,
                          Real                     time,
                          int                      src_comp,
                          int                      dest_comp,
                          int                      num_comp,
                          bool                     extrap)
{
    BL_PROFILE("StateData::InterpFillFab()");
    if (desc->timeType() == StateDescriptor::Point)
    {
        if (old_data == nullptr)
        {
            multiFabCopyDesc.FillFab(mfid[MFNEWDATA], fillBoxIds[0], dest);
        }
        else
        {
            amrex::InterpFillFab(multiFabCopyDesc,
                                 fillBoxIds,
                                 mfid[MFOLDDATA],
                                 mfid[MFNEWDATA],
                                 dest,
                                 old_time.start,
                                 new_time.start,
                                 time,
                                 src_comp,
                                 dest_comp,
                                 num_comp,
                                 extrap);
        }
    }
    else
    {
        const Real teps = (new_time.start - old_time.start)*1.e-3_rt;

        if (time > new_time.start-teps && time < new_time.stop+teps)
        {
            multiFabCopyDesc.FillFab(mfid[MFNEWDATA], fillBoxIds[0], dest);
        }
        else if (old_data != nullptr        &&
                 time > old_time.start-teps &&
                 time < old_time.stop+teps)
        {
            multiFabCopyDesc.FillFab(mfid[MFOLDDATA], fillBoxIds[0], dest);
        }
        else
        {
            amrex::Error("StateData::Interp(): cannot interp");
        }
    }
}